

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O3

VariableIndex __thiscall dynet::ComputationGraph::add_parameters(ComputationGraph *this,Parameter p)

{
  pointer *pppNVar1;
  iterator __position;
  iterator __position_00;
  ParameterNode *this_00;
  ParameterStorage *pPVar2;
  uint uVar3;
  VariableIndex new_node_index;
  uint local_34;
  ParameterNode *local_30;
  Parameter local_28;
  
  uVar3 = (uint)((ulong)((long)(this->nodes).
                               super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->nodes).
                              super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3);
  local_34 = uVar3;
  local_28.p = p.p;
  this_00 = (ParameterNode *)operator_new(0x98);
  ParameterNode::ParameterNode(this_00,&local_28);
  __position._M_current =
       (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_30 = this_00;
  if (__position._M_current ==
      (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<dynet::Node*,std::allocator<dynet::Node*>>::_M_realloc_insert<dynet::Node*>
              ((vector<dynet::Node*,std::allocator<dynet::Node*>> *)this,__position,
               (Node **)&local_30);
  }
  else {
    *__position._M_current = (Node *)this_00;
    pppNVar1 = &(this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  pPVar2 = Parameter::get_storage(&local_28);
  (this->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish[-1]->device = pPVar2->device;
  __position_00._M_current =
       (this->parameter_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (this->parameter_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->parameter_nodes,
               __position_00,&local_34);
  }
  else {
    *__position_00._M_current = uVar3;
    (this->parameter_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = __position_00._M_current + 1;
  }
  set_dim_for_new_node(this,&local_34);
  return local_34;
}

Assistant:

VariableIndex ComputationGraph::add_parameters(Parameter p) {
  VariableIndex new_node_index(nodes.size());
  ParameterNode* new_node = new ParameterNode(p);
  nodes.push_back(new_node);
  nodes.back()->device = p.get_storage().device;
  parameter_nodes.push_back(new_node_index);
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}